

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O2

int RSA_marshal_private_key(CBB *cbb,RSA *rsa)

{
  int iVar1;
  CBB child;
  
  iVar1 = CBB_add_asn1(cbb,&child,0x20000010);
  if ((((((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&child,0), iVar1 != 0)) &&
        (iVar1 = marshal_integer(&child,rsa->n), iVar1 != 0)) &&
       ((iVar1 = marshal_integer(&child,rsa->e), iVar1 != 0 &&
        (iVar1 = marshal_integer(&child,rsa->d), iVar1 != 0)))) &&
      ((iVar1 = marshal_integer(&child,rsa->p), iVar1 != 0 &&
       ((iVar1 = marshal_integer(&child,rsa->q), iVar1 != 0 &&
        (iVar1 = marshal_integer(&child,rsa->dmp1), iVar1 != 0)))))) &&
     ((iVar1 = marshal_integer(&child,rsa->dmq1), iVar1 != 0 &&
      ((iVar1 = marshal_integer(&child,rsa->iqmp), iVar1 != 0 &&
       (iVar1 = CBB_flush(cbb), iVar1 != 0)))))) {
    return 1;
  }
  ERR_put_error(4,0,0x79,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                ,0xbb);
  return 0;
}

Assistant:

int RSA_marshal_private_key(CBB *cbb, const RSA *rsa) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&child, kVersionTwoPrime) ||
      !marshal_integer(&child, rsa->n) ||
      !marshal_integer(&child, rsa->e) ||
      !marshal_integer(&child, rsa->d) ||
      !marshal_integer(&child, rsa->p) ||
      !marshal_integer(&child, rsa->q) ||
      !marshal_integer(&child, rsa->dmp1) ||
      !marshal_integer(&child, rsa->dmq1) ||
      !marshal_integer(&child, rsa->iqmp) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}